

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopObj.c
# Opt level: O1

Hop_Obj_t * Hop_ObjCreatePi(Hop_Man_t *p)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  Hop_Obj_t *pHVar3;
  void **ppvVar4;
  int iVar5;
  
  pHVar3 = Hop_ManFetchMemory(p);
  *(uint *)&pHVar3->field_0x20 = *(uint *)&pHVar3->field_0x20 & 0xfffffff8 | 2;
  (pHVar3->field_1).PioNum = p->vPis->nSize;
  pVVar2 = p->vPis;
  uVar1 = pVVar2->nCap;
  if (pVVar2->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar2->pArray,0x80);
      }
      pVVar2->pArray = ppvVar4;
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar1 * 2;
      if (iVar5 <= (int)uVar1) goto LAB_00764154;
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
      }
      pVVar2->pArray = ppvVar4;
    }
    pVVar2->nCap = iVar5;
  }
LAB_00764154:
  iVar5 = pVVar2->nSize;
  pVVar2->nSize = iVar5 + 1;
  pVVar2->pArray[iVar5] = pHVar3;
  p->nObjs[2] = p->nObjs[2] + 1;
  return pHVar3;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates primary input.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Hop_Obj_t * Hop_ObjCreatePi( Hop_Man_t * p )
{
    Hop_Obj_t * pObj;
    pObj = Hop_ManFetchMemory( p );
    pObj->Type = AIG_PI;
    pObj->PioNum = Vec_PtrSize( p->vPis );
    Vec_PtrPush( p->vPis, pObj );
    p->nObjs[AIG_PI]++;
    return pObj;
}